

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxFacts.cpp
# Opt level: O0

bool slang::syntax::SyntaxFacts::isPossibleModportPort(TokenKind kind)

{
  TokenKind kind_local;
  bool local_1;
  
  if (((((kind == OpenParenthesis) || (kind == Comma)) || (kind == ClockingKeyword)) ||
      ((kind == ExportKeyword || (kind == ImportKeyword)))) ||
     (((ushort)(kind - InOutKeyword) < 2 || ((kind == OutputKeyword || (kind == RefKeyword)))))) {
    local_1 = true;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool SyntaxFacts::isPossibleModportPort(TokenKind kind) {
    switch (kind) {
        case TokenKind::OpenParenthesis:
        case TokenKind::InputKeyword:
        case TokenKind::OutputKeyword:
        case TokenKind::InOutKeyword:
        case TokenKind::RefKeyword:
        case TokenKind::ClockingKeyword:
        case TokenKind::ImportKeyword:
        case TokenKind::ExportKeyword:
        case TokenKind::Comma:
            return true;
        default:
            return false;
    }
}